

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall dxil_spv::Converter::Impl::add(Impl *this,Operation *op,bool is_rov)

{
  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *pvVar1;
  Operation *local_28;
  Operation *local_20;
  
  pvVar1 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
           this->current_block;
  local_28 = op;
  if (pvVar1 != (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *
                )0x0) {
    if (is_rov) {
      local_20 = allocate(this,OpBeginInvocationInterlockEXT);
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      emplace_back<dxil_spv::Operation*>(pvVar1,&local_20);
      std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
      push_back(this->current_block,&local_28);
      pvVar1 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
               this->current_block;
      local_20 = allocate(this,OpEndInvocationInterlockEXT);
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      emplace_back<dxil_spv::Operation*>(pvVar1,&local_20);
    }
    else {
      std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
      push_back((vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                 *)pvVar1,&local_28);
    }
    return;
  }
  __assert_fail("current_block",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                ,0x1ecd,"void dxil_spv::Converter::Impl::add(Operation *, bool)");
}

Assistant:

void Converter::Impl::add(Operation *op, bool is_rov)
{
	assert(current_block);
	if (is_rov)
		current_block->push_back(allocate(spv::OpBeginInvocationInterlockEXT));
	current_block->push_back(op);
	if (is_rov)
		current_block->push_back(allocate(spv::OpEndInvocationInterlockEXT));
}